

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmClassPrototype(ExpressionContext *ctx,VmModule *module,ExprClassPrototype *node)

{
  VmValue *pVVar1;
  ExprClassPrototype *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar1 = anon_unknown.dwarf_aa461::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmClassPrototype(ExpressionContext &ctx, VmModule *module, ExprClassPrototype *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}